

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawLineCharacter
               (mline_t *lineguy,int lineguylines,double scale,DAngle *angle,AMColor *color,double x
               ,double y)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  mline_t local_88;
  double local_68;
  DAngle local_58;
  DAngle local_50;
  double local_48;
  double dStack_40;
  
  if (0 < lineguylines) {
    lVar4 = 0;
    local_68 = scale;
    local_48 = scale;
    dStack_40 = scale;
    do {
      pdVar1 = (double *)((long)&(lineguy->a).x + lVar4);
      dVar2 = *pdVar1;
      dVar3 = pdVar1[1];
      local_88.a.x = dVar2 * local_48;
      local_88.a.y = dVar3 * dStack_40;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        local_88.a.x = dVar2;
        local_88.a.y = dVar3;
      }
      dVar2 = angle->Degrees;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        local_50.Degrees = dVar2;
        AM_rotate((double *)&local_88,&local_88.a.y,&local_50);
      }
      local_88.a.x = local_88.a.x + x;
      local_88.a.y = local_88.a.y + y;
      pdVar1 = (double *)((long)&(lineguy->b).x + lVar4);
      dVar2 = *pdVar1;
      dVar3 = pdVar1[1];
      local_88.b.x = dVar2 * local_48;
      local_88.b.y = dVar3 * dStack_40;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        local_88.b.x = dVar2;
        local_88.b.y = dVar3;
      }
      dVar2 = angle->Degrees;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        local_58.Degrees = dVar2;
        AM_rotate(&local_88.b.x,&local_88.b.y,&local_58);
      }
      local_88.b.x = local_88.b.x + x;
      local_88.b.y = local_88.b.y + y;
      AM_drawMline(&local_88,color);
      lVar4 = lVar4 + 0x20;
    } while ((ulong)(uint)lineguylines << 5 != lVar4);
  }
  return;
}

Assistant:

void
AM_drawLineCharacter
( const mline_t *lineguy,
  int		lineguylines,
  double	scale,
  DAngle	angle,
  const AMColor &color,
  double	x,
  double	y )
{
	int		i;
	mline_t	l;

	for (i=0;i<lineguylines;i++) {
		l.a.x = lineguy[i].a.x;
		l.a.y = lineguy[i].a.y;

		if (scale) {
			l.a.x *= scale;
			l.a.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.a.x, &l.a.y, angle);

		l.a.x += x;
		l.a.y += y;

		l.b.x = lineguy[i].b.x;
		l.b.y = lineguy[i].b.y;

		if (scale) {
			l.b.x *= scale;
			l.b.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.b.x, &l.b.y, angle);

		l.b.x += x;
		l.b.y += y;

		AM_drawMline(&l, color);
	}
}